

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_conspage(conspage *base,int linking)

{
  LispPTR LVar1;
  int local_24;
  conspage *pcStack_20;
  int i;
  ConsCell *cell;
  conspage *pcStack_10;
  int linking_local;
  conspage *base_local;
  
  pcStack_10 = base;
  while( true ) {
    LVar1 = LAddrFromNative(pcStack_10);
    printf("conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page is 0x%x(lisp)\n"
           ,(ulong)LVar1,(ulong)(*(uint *)&pcStack_10->field_0x8 >> 0x18),
           (ulong)(*(uint *)&pcStack_10->field_0x8 >> 0x10 & 0xff),(ulong)pcStack_10->next_page);
    pcStack_20 = pcStack_10;
    for (local_24 = 0; pcStack_20 = (conspage *)&pcStack_20->cell4, local_24 < 0x7f;
        local_24 = local_24 + 1) {
      LVar1 = LAddrFromNative(pcStack_20);
      printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n",(ulong)LVar1,
             (ulong)(local_24 + 1),(ulong)(*(uint *)pcStack_20 >> 0x1c),
             (ulong)(*(uint *)pcStack_20 & 0xfffffff));
    }
    if ((linking != 1) || (pcStack_10->next_page == 0)) break;
    pcStack_10 = (conspage *)NativeAligned4FromLPage(pcStack_10->next_page);
  }
  return;
}

Assistant:

void dump_conspage(struct conspage *base, int linking)
/* target conspage address */
/* look for chaining conspage ? T/NIL */
{
  ConsCell *cell;
  int i;

lp:
  printf(
      "conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page "
      "is 0x%x(lisp)\n",
      LAddrFromNative(base), (0xff & base->count), (0xff & base->next_cell), base->next_page);

  for (i = 0, cell = (ConsCell *)base + 1; i < 127; i++, cell++) {
    printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n", LAddrFromNative(cell), i + 1,
           cell->cdr_code, cell->car_field);
  }

  if ((linking == T) && (base->next_page != NIL_PTR)) {
    base = (struct conspage *)NativeAligned4FromLPage(base->next_page);
    goto lp;
  }

}